

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this,Element *first,Element *last)

{
  _func_int **pp_Var1;
  char cVar2;
  uint uVar3;
  Node *pNVar4;
  vec2 *pvVar5;
  vec2 renderSize;
  vec2 textureSize;
  vec2 renderSize_00;
  GLuint GVar6;
  Format format;
  long lVar7;
  mat4 *pmVar8;
  undefined8 *puVar9;
  float *pfVar10;
  undefined4 *puVar11;
  mat4 *this_00;
  undefined4 *puVar12;
  undefined1 *puVar13;
  TexturePool *this_01;
  BlurNode *blurNode;
  Element *pEVar14;
  byte bVar15;
  float fVar16;
  mat4 in_stack_fffffffffffffe08;
  undefined4 local_1a8 [18];
  float local_160 [2];
  mat4 storedProj;
  float fStack_b4;
  undefined8 local_a8;
  undefined4 local_a0;
  float local_9c;
  undefined8 local_98;
  undefined4 local_90;
  float local_8c;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  mat4 *local_60;
  vec2 local_58;
  undefined8 uStack_50;
  float local_3c;
  TexturePool *local_38;
  
  bVar15 = 0;
  pEVar14 = first;
  if (this->m_numLayeredNodes != 0) {
    for (; pEVar14 < last; pEVar14 = pEVar14 + 1) {
      if ((pEVar14->field_0x1b & 0x40) != 0) {
        renderToLayer(this,pEVar14);
        pEVar14 = pEVar14 + (*(uint *)&pEVar14->field_0x18 & 0x1fffffff);
      }
    }
  }
  glViewport(0,0,(int)(this->m_surfaceSize).x,(int)(this->m_surfaceSize).y);
  local_60 = &this->m_proj;
  local_38 = &this->m_texturePool;
  pEVar14 = first + 1;
  do {
    this_00 = local_60;
    if (last <= pEVar14 + -1) {
      return;
    }
    uVar3 = *(uint *)&pEVar14[-1].field_0x18;
    if ((int)uVar3 < 0) goto LAB_0012119a;
    pNVar4 = pEVar14[-1].node;
    cVar2 = pNVar4->field_0x30;
    switch(cVar2) {
    case '\x02':
      if ((0x3fffffff < uVar3) && (pEVar14[-1].texture != 0)) {
        drawTextureQuad(this,pEVar14[-1].vboOffset,pEVar14[-1].texture,*(float *)&pNVar4->field_0x34
                        ,RGBA_32);
        goto LAB_0012110a;
      }
LAB_00121119:
      if ((uVar3 >> 0x1d & 1) == 0) {
        if (((cVar2 == 'C') &&
            ((fVar16 = *(float *)((long)&pNVar4[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
                       *(float *)&pNVar4->field_0x34, fVar16 != 0.0 || (NAN(fVar16))))) &&
           ((fVar16 = *(float *)&pNVar4[1].super_SignalEmitter.m_buckets -
                      *(float *)&pNVar4[1].super_SignalEmitter._vptr_SignalEmitter, fVar16 != 0.0 ||
            (NAN(fVar16))))) {
          activateShader(this,(Program *)0x0);
          glBindBuffer(0x8892,0);
          (*(pNVar4->super_SignalEmitter)._vptr_SignalEmitter[5])(pNVar4);
          setDefaultOpenGLState(this);
        }
      }
      else {
        std::__sort<rengine::OpenGLRenderer::Element*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pEVar14,pEVar14 + (uVar3 & 0x1fffffff));
      }
      break;
    case '\x03':
      if ((uVar3 < 0x40000000) || (GVar6 = pEVar14[-1].texture, GVar6 == 0)) goto LAB_00121119;
      uVar3 = pEVar14[-1].vboOffset;
      puVar11 = (undefined4 *)&pNVar4->field_0x34;
      puVar12 = local_1a8;
      for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar12 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
        puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
      }
      puVar11 = local_1a8;
      puVar13 = &stack0xfffffffffffffe08;
      for (lVar7 = 0x44; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar13 = *(undefined1 *)puVar11;
        puVar11 = (undefined4 *)((long)puVar11 + (ulong)bVar15 * -2 + 1);
        puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
      }
      drawColorFilterQuad(this,uVar3,GVar6,in_stack_fffffffffffffe08);
      goto LAB_0012110a;
    case '\x04':
      if ((uVar3 < 0x40000000) || (pEVar14[-1].texture == 0)) goto LAB_00121119;
      uVar3 = pEVar14[-1].vboOffset;
      pvVar5 = this->m_vertices;
      fVar16 = pvVar5[uVar3 + 0xb].y - pvVar5[uVar3 + 8].y;
      renderSize.y = fVar16;
      renderSize.x = pvVar5[uVar3 + 0xb].x - pvVar5[uVar3 + 8].x;
      textureSize.y = pvVar5[uVar3 + 7].y - pvVar5[uVar3 + 4].y;
      textureSize.x = pvVar5[uVar3 + 7].x - pvVar5[uVar3 + 4].x;
      drawBlurQuad(this,uVar3 + 8,pEVar14[-1].texture,*(int *)&pNVar4->field_0x34,renderSize,
                   textureSize,(vec2)((ulong)(uint)(1.0 / fVar16) << 0x20));
LAB_0012110a:
      GVar6 = pEVar14[-1].texture;
      this_01 = local_38;
LAB_00121112:
      TexturePool::release(this_01,GVar6);
      break;
    case '\x05':
      if ((uVar3 < 0x40000000) || (pEVar14[-1].texture == 0)) goto LAB_00121119;
      uVar3 = pEVar14[-1].vboOffset;
      pvVar5 = this->m_vertices;
      local_58.y = pvVar5[uVar3 + 7].y - pvVar5[uVar3 + 4].y;
      local_58.x = pvVar5[uVar3 + 7].x - pvVar5[uVar3 + 4].x;
      uStack_50 = 0;
      fVar16 = pvVar5[uVar3 + 0xb].y - pvVar5[uVar3 + 8].y;
      renderSize_00.y = fVar16;
      renderSize_00.x = pvVar5[uVar3 + 0xb].x - pvVar5[uVar3 + 8].x;
      pmVar8 = local_60;
      pfVar10 = local_160;
      for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pfVar10 = pmVar8->m[0];
        pmVar8 = (mat4 *)((long)pmVar8 + (ulong)bVar15 * -8 + 4);
        pfVar10 = pfVar10 + (ulong)bVar15 * -2 + 1;
      }
      pp_Var1 = pNVar4[1].super_SignalEmitter._vptr_SignalEmitter;
      local_3c = roundf(SUB84(pp_Var1,0));
      fStack_b4 = (float)((ulong)pp_Var1 >> 0x20);
      local_8c = roundf(fStack_b4);
      local_a8 = 0x3f800000;
      local_a0 = 0;
      local_9c = local_3c;
      local_98 = 0x3f80000000000000;
      local_90 = 0;
      local_88 = 0;
      local_80 = 0x3f800000;
      local_7c = 0;
      uStack_74 = 0;
      local_6c = 0x13f800000;
      puVar9 = &local_a8;
      puVar13 = &stack0xfffffffffffffe08;
      for (lVar7 = 0x44; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar13 = *(undefined1 *)puVar9;
        puVar9 = (undefined8 *)((long)puVar9 + (ulong)bVar15 * -2 + 1);
        puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
      }
      mat4::operator*((mat4 *)(storedProj.m + 0xf),this_00,in_stack_fffffffffffffe08);
      pfVar10 = storedProj.m + 0xf;
      pmVar8 = this_00;
      for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
        pmVar8->m[0] = *pfVar10;
        pfVar10 = pfVar10 + (ulong)bVar15 * -2 + 1;
        pmVar8 = (mat4 *)((long)pmVar8 + (ulong)bVar15 * -8 + 4);
      }
      *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
      drawShadowQuad(this,pEVar14[-1].vboOffset + 8,pEVar14[-1].texture,*(int *)&pNVar4->field_0x34,
                     renderSize_00,local_58,(vec2)((ulong)(uint)(1.0 / fVar16) << 0x20),
                     *(vec4 *)&pNVar4[1].super_SignalEmitter.m_buckets);
      pfVar10 = local_160;
      for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
        this_00->m[0] = *pfVar10;
        pfVar10 = pfVar10 + (ulong)bVar15 * -2 + 1;
        this_00 = (mat4 *)((long)this_00 + (ulong)bVar15 * -8 + 4);
      }
      *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
      drawTextureQuad(this,pEVar14[-1].vboOffset + 0xc,pEVar14[-1].sourceTexture,1.0,RGBA_32);
      this_01 = local_38;
      TexturePool::release(local_38,pEVar14[-1].texture);
      GVar6 = pEVar14[-1].sourceTexture;
      goto LAB_00121112;
    default:
      if (cVar2 == 'B') {
        pNVar4 = pNVar4[1].m_parent;
        local_58.x = (float)pEVar14[-1].vboOffset;
        GVar6 = (*(pNVar4->super_SignalEmitter)._vptr_SignalEmitter[4])(pNVar4);
        format = (*(pNVar4->super_SignalEmitter)._vptr_SignalEmitter[3])(pNVar4);
        drawTextureQuad(this,(uint)local_58.x,GVar6,1.0,format);
      }
      else {
        if (cVar2 != 'A') goto LAB_00121119;
        drawColorQuad(this,pEVar14[-1].vboOffset,
                      *(vec4 *)((long)&pNVar4[1].super_SignalEmitter.m_buckets + 4));
      }
    }
    pEVar14[-1].field_0x1b = pEVar14[-1].field_0x1b | 0x80;
LAB_0012119a:
    pEVar14 = pEVar14 + 1;
  } while( true );
}

Assistant:

inline void OpenGLRenderer::render(Element *first, Element *last)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "render " << first << " -> " << last - 1 << std::endl;

    // Check if we need to flatten something in this range
    if (m_numLayeredNodes > 0) {
        Element *e = first;
        // std::cout << space << "- checking layering for " << e << std::endl;
        while (e < last) {
            if (e->layered) {
                // std::cout << space << "- needs layering: " << e << std::endl;
                // ++recursion;
                renderToLayer(e);
                // --recursion;
                e = e + e->groupSize + 1;
            } else {
                ++e;
            }
        }
    }

    //
    glViewport(0, 0, m_surfaceSize.x, m_surfaceSize.y);

    Element *e = first;
    while (e < last) {
        // std::cout << space << "- render(normal) " << e << " node=(" << e->node << ") " << (e->completed ? "*done*" : "") << std::endl;
        if (e->completed) {
            ++e;
            continue;
        }

        if (e->node->type() == Node::RectangleNodeType) {
            // std::cout << space << "---> rect quad, vbo=" << e->vboOffset
            //      << " " << m_proj * m_vertices[e->vboOffset] << " " << m_proj * m_vertices[e->vboOffset+3] << std::endl;
            drawColorQuad(e->vboOffset, static_cast<RectangleNode *>(e->node)->color());
        } else if (e->node->type() == Node::TextureNodeType) {
            // std::cout << space << "---> texture quad, vbo=" << e->vboOffset << std::endl;
            const Texture *texture = static_cast<TextureNode *>(e->node)->texture();
            drawTextureQuad(e->vboOffset, texture->textureId(), 1.0f, texture->format());
        } else if (e->node->type() == Node::OpacityNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawTextureQuad(e->vboOffset, e->texture, static_cast<OpacityNode *>(e->node)->opacity());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ColorFilterNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawColorFilterQuad(e->vboOffset, e->texture, static_cast<ColorFilterNode *>(e->node)->colorMatrix());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::BlurNodeType && e->layered && e->texture) {
            // std::cout << space << "---> blur texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            BlurNode *blurNode = static_cast<BlurNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            // std::cout << " - radius: " << blurNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawBlurQuad(e->vboOffset + 8, e->texture, blurNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y));
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ShadowNodeType && e->layered && e->texture) {
            // std::cout << "---> shadow texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            ShadowNode *shadowNode = static_cast<ShadowNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            mat4 storedProj = m_proj;
            m_proj = m_proj * mat4::translate2D(std::round(shadowNode->offset().x), std::round(shadowNode->offset().y));
            m_matrixState |= UpdateShadowProgram;
            // std::cout << " - radius: " << shadowNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawShadowQuad(e->vboOffset + 8, e->texture, shadowNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y), shadowNode->color());
            m_proj = storedProj;
            m_matrixState |= UpdateShadowProgram;
            drawTextureQuad(e->vboOffset + 12, e->sourceTexture);
            m_texturePool.release(e->texture);
            m_texturePool.release(e->sourceTexture);
        } else if (e->projection) {
            std::sort(e + 1, e + e->groupSize + 1);
            // std::cout << space << "---> projection, sorting range: " << (e+1) << " -> " << (e+e->groupSize) << std::endl;
        } else if (e->node->type() == Node::RenderNodeType) {
            RenderNode *rn = static_cast<RenderNode *>(e->node);
            if (rn->width() != 0 && rn->height() != 0) {
                activateShader(0);
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                rn->render();
                setDefaultOpenGLState();
            }
        }

        e->completed = true;
        ++e;
    }
}